

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

bool __thiscall Uniforms::feedTo(Uniforms *this,Shader *_shader,bool _lights,bool _buffers)

{
  ulong uVar1;
  Texture *_tex;
  size_t sVar2;
  unsigned_long uVar3;
  bool bVar4;
  int iVar5;
  GLuint _textureId;
  int iVar6;
  pointer ppVar7;
  pointer ppVar8;
  pointer ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  reference pvVar12;
  pointer pvVar13;
  pointer ppVar14;
  pointer ppVar15;
  pointer ppVar16;
  undefined4 extraout_var;
  size_type sVar17;
  reference ppFVar18;
  reference ppPVar19;
  reference pvVar20;
  reference this_00;
  Fbo *pFVar21;
  size_type sVar22;
  pointer ppVar23;
  undefined4 extraout_var_00;
  LightType *pLVar24;
  mat4 *pmVar25;
  undefined4 extraout_var_01;
  float _x;
  float _x_00;
  float _x_01;
  float _x_02;
  float _x_03;
  allocator local_549;
  string local_548;
  allocator local_521;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  undefined1 local_440 [8];
  string name;
  _Self local_418;
  iterator it_6;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
  local_2f8;
  iterator it_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  unsigned_long local_2b0;
  size_t i_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  unsigned_long local_268;
  size_t i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  unsigned_long local_220;
  size_t i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  unsigned_long local_1d8;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  unsigned_long local_b0;
  size_t i;
  _Self local_a0;
  iterator it_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Self local_68;
  _Self local_60;
  iterator it_3;
  size_t frame;
  _Self local_48;
  iterator it_2;
  _Self local_38;
  iterator it_1;
  _Self local_28;
  iterator it;
  bool update;
  bool _buffers_local;
  bool _lights_local;
  Shader *_shader_local;
  Uniforms *this_local;
  
  it._M_node._5_1_ = 0;
  it._M_node._6_1_ = _buffers;
  it._M_node._7_1_ = _lights;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
       ::begin(&this->functions);
  while( true ) {
    it_1._M_node = (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
                   ::end(&this->functions);
    bVar4 = std::operator!=(&local_28,(_Self *)&it_1);
    if (!bVar4) break;
    if ((it._M_node._7_1_ & 1) == 0) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
               ::operator->(&local_28);
      bVar4 = std::operator==(&ppVar7->first,"u_scene");
      if (!bVar4) {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                 ::operator->(&local_28);
        bVar4 = std::operator==(&ppVar7->first,"u_sceneDepth");
        if (!bVar4) {
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                   ::operator->(&local_28);
          bVar4 = std::operator==(&ppVar7->first,"u_sceneNormal");
          if (!bVar4) {
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                     ::operator->(&local_28);
            bVar4 = std::operator==(&ppVar7->first,"u_scenePosition");
            if (!bVar4) goto LAB_003b8138;
          }
        }
      }
    }
    else {
LAB_003b8138:
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
               ::operator->(&local_28);
      if (((ppVar7->second).present & 1U) != 0) {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                 ::operator->(&local_28);
        bVar4 = std::function::operator_cast_to_bool((function *)&ppVar7->second);
        if (bVar4) {
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
                   ::operator->(&local_28);
          std::function<void_(vera::Shader_&)>::operator()(&(ppVar7->second).assign,_shader);
        }
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>
    ::operator++(&local_28);
  }
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
       ::begin(&this->data);
  while( true ) {
    it_2._M_node = (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                   ::end(&this->data);
    bVar4 = std::operator!=(&local_38,(_Self *)&it_2);
    if (!bVar4) break;
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
             ::operator->(&local_38);
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
             ::operator->(&local_38);
    pvVar13 = std::array<float,_4UL>::data(&(ppVar9->second).value);
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
             ::operator->(&local_38);
    vera::Shader::setUniform(_shader,&ppVar8->first,pvVar13,(ppVar9->second).size);
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
             ::operator->(&local_38);
    if (((ppVar8->second).change & 1U) != 0) {
      it._M_node._5_1_ = (it._M_node._5_1_ & 1) != 0xffffffff;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
    ::operator++(&local_38);
  }
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>_>
       ::begin(&this->sequences);
  while( true ) {
    frame = (size_t)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>_>
                    ::end(&this->sequences);
    bVar4 = std::operator!=(&local_48,(_Self *)&frame);
    if (!bVar4) break;
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
              ::operator->(&local_48);
    sVar17 = std::vector<UniformData,_std::allocator<UniformData>_>::size(&ppVar10->second);
    if (sVar17 != 0) {
      uVar1 = this->m_frame;
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
                ::operator->(&local_48);
      sVar17 = std::vector<UniformData,_std::allocator<UniformData>_>::size(&ppVar10->second);
      it_3._M_node = (_Base_ptr)(uVar1 % sVar17);
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
                ::operator->(&local_48);
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
                ::operator->(&local_48);
      pvVar12 = std::vector<UniformData,_std::allocator<UniformData>_>::operator[]
                          (&ppVar11->second,(size_type)it_3._M_node);
      pvVar13 = std::array<float,_4UL>::data(&pvVar12->value);
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
                ::operator->(&local_48);
      pvVar12 = std::vector<UniformData,_std::allocator<UniformData>_>::operator[]
                          (&ppVar11->second,(size_type)it_3._M_node);
      vera::Shader::setUniform(_shader,&ppVar10->first,pvVar13,pvVar12->size);
      it._M_node._5_1_ = (it._M_node._5_1_ & 1) != 0xffffffff;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>
    ::operator++(&local_48);
  }
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
       ::begin(&(this->super_Scene).textures);
  while( true ) {
    local_68._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
         ::end(&(this->super_Scene).textures);
    bVar4 = std::operator!=(&local_60,&local_68);
    if (!bVar4) break;
    ppVar14 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
              ::operator->(&local_60);
    ppVar15 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
              ::operator->(&local_60);
    _tex = ppVar15->second;
    sVar2 = _shader->textureIndex;
    _shader->textureIndex = sVar2 + 1;
    vera::Shader::setUniformTexture(_shader,&ppVar14->first,_tex,sVar2);
    ppVar14 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
              ::operator->(&local_60);
    std::operator+(&local_88,&ppVar14->first,"Resolution");
    ppVar14 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
              ::operator->(&local_60);
    iVar6 = (*ppVar14->second->_vptr_Texture[0xc])();
    ppVar14 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
              ::operator->(&local_60);
    iVar5 = (*ppVar14->second->_vptr_Texture[0xd])();
    vera::Shader::setUniform(_shader,&local_88,(float)iVar6,(float)iVar5);
    std::__cxx11::string::~string((string *)&local_88);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>
    ::operator++(&local_60);
  }
  local_a0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
       ::begin(&(this->super_Scene).streams);
  while( true ) {
    i = (size_t)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
                ::end(&(this->super_Scene).streams);
    bVar4 = std::operator!=(&local_a0,(_Self *)&i);
    if (!bVar4) break;
    local_b0 = 0;
    while( true ) {
      uVar3 = local_b0;
      ppVar16 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_a0);
      iVar6 = (*(ppVar16->second->super_Texture)._vptr_Texture[0x14])();
      if (CONCAT44(extraout_var,iVar6) <= uVar3) break;
      ppVar16 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_a0);
      std::operator+(&local_110,&ppVar16->first,"Prev[");
      vera::toString<unsigned_long>(&local_130,&local_b0);
      std::operator+(&local_f0,&local_110,&local_130);
      std::operator+(&local_d0,&local_f0,"]");
      ppVar16 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                ::operator->(&local_a0);
      _textureId = (*(ppVar16->second->super_Texture)._vptr_Texture[0x15])(ppVar16->second,local_b0)
      ;
      sVar2 = _shader->textureIndex;
      _shader->textureIndex = sVar2 + 1;
      vera::Shader::setUniformTexture(_shader,&local_d0,_textureId,sVar2);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      local_b0 = local_b0 + 1;
    }
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
              ::operator->(&local_a0);
    std::operator+(&local_150,&ppVar16->first,"Time");
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
              ::operator->(&local_a0);
    (*(ppVar16->second->super_Texture)._vptr_Texture[0x1a])();
    vera::Shader::setUniform(_shader,&local_150,_x);
    std::__cxx11::string::~string((string *)&local_150);
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
              ::operator->(&local_a0);
    std::operator+(&local_170,&ppVar16->first,"Fps");
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
              ::operator->(&local_a0);
    (*(ppVar16->second->super_Texture)._vptr_Texture[0x18])();
    vera::Shader::setUniform(_shader,&local_170,_x_00);
    std::__cxx11::string::~string((string *)&local_170);
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
              ::operator->(&local_a0);
    std::operator+(&local_190,&ppVar16->first,"Duration");
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
              ::operator->(&local_a0);
    (*(ppVar16->second->super_Texture)._vptr_Texture[0x19])();
    vera::Shader::setUniform(_shader,&local_190,_x_01);
    std::__cxx11::string::~string((string *)&local_190);
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
              ::operator->(&local_a0);
    std::operator+(&local_1b0,&ppVar16->first,"CurrentFrame");
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
              ::operator->(&local_a0);
    (*(ppVar16->second->super_Texture)._vptr_Texture[0x1d])();
    vera::Shader::setUniform(_shader,&local_1b0,_x_02);
    std::__cxx11::string::~string((string *)&local_1b0);
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
              ::operator->(&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                   &ppVar16->first,"TotalFrames");
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
              ::operator->(&local_a0);
    (*(ppVar16->second->super_Texture)._vptr_Texture[0x1c])();
    vera::Shader::setUniform(_shader,(string *)&i_1,_x_03);
    std::__cxx11::string::~string((string *)&i_1);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
    ::operator++(&local_a0);
  }
  if ((it._M_node._6_1_ & 1) != 0) {
    for (local_1d8 = 0; uVar3 = local_1d8,
        sVar17 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&this->buffers),
        uVar3 < sVar17; local_1d8 = local_1d8 + 1) {
      vera::toString<unsigned_long>((string *)&i_2,&local_1d8);
      std::operator+(&local_1f8,"u_buffer",(string *)&i_2);
      ppFVar18 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                           (&this->buffers,local_1d8);
      pFVar21 = *ppFVar18;
      sVar2 = _shader->textureIndex;
      _shader->textureIndex = sVar2 + 1;
      vera::Shader::setUniformTexture(_shader,&local_1f8,pFVar21,sVar2);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&i_2);
    }
    for (local_220 = 0; uVar3 = local_220,
        sVar17 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::size
                           (&this->doubleBuffers), uVar3 < sVar17; local_220 = local_220 + 1) {
      vera::toString<unsigned_long>((string *)&i_3,&local_220);
      std::operator+(&local_240,"u_doubleBuffer",(string *)&i_3);
      ppPVar19 = std::vector<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>::operator[]
                           (&this->doubleBuffers,local_220);
      pFVar21 = (*ppPVar19)->src;
      sVar2 = _shader->textureIndex;
      _shader->textureIndex = sVar2 + 1;
      vera::Shader::setUniformTexture(_shader,&local_240,pFVar21,sVar2);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&i_3);
    }
    for (local_268 = 0; uVar3 = local_268,
        sVar17 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::size(&this->floods),
        uVar3 < sVar17; local_268 = local_268 + 1) {
      vera::toString<unsigned_long>((string *)&i_4,&local_268);
      std::operator+(&local_288,"u_flood",(string *)&i_4);
      pvVar20 = std::vector<vera::Flood,_std::allocator<vera::Flood>_>::operator[]
                          (&this->floods,local_268);
      pFVar21 = (pvVar20->super_PingPong).dst;
      sVar2 = _shader->textureIndex;
      _shader->textureIndex = sVar2 + 1;
      vera::Shader::setUniformTexture(_shader,&local_288,pFVar21,sVar2);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&i_4);
    }
  }
  for (local_2b0 = 0; uVar3 = local_2b0,
      sVar17 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::size(&this->pyramids),
      uVar3 < sVar17; local_2b0 = local_2b0 + 1) {
    vera::toString<unsigned_long>((string *)&it_5,&local_2b0);
    std::operator+(&local_2d0,"u_pyramid",(string *)&it_5);
    this_00 = std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::operator[]
                        (&this->pyramids,local_2b0);
    pFVar21 = vera::Pyramid::getResult(this_00,0);
    sVar2 = _shader->textureIndex;
    _shader->textureIndex = sVar2 + 1;
    vera::Shader::setUniformTexture(_shader,&local_2d0,pFVar21,sVar2);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&it_5);
  }
  if ((it._M_node._7_1_ & 1) == 0) goto LAB_003b9c25;
  sVar22 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
           ::size(&(this->super_Scene).lights);
  if (sVar22 == 1) {
    local_2f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
         ::begin(&(this->super_Scene).lights);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"u_lightColor",&local_319);
    ppVar23 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
              ::operator->(&local_2f8);
    vera::Shader::setUniform(_shader,&local_318,&ppVar23->second->color);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_340,"u_lightIntensity",&local_341);
    ppVar23 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
              ::operator->(&local_2f8);
    vera::Shader::setUniform(_shader,&local_340,ppVar23->second->intensity);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,"u_light",&local_369);
    ppVar23 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
              ::operator->(&local_2f8);
    iVar6 = (*(ppVar23->second->super_Node)._vptr_Node[0x13])();
    vera::Shader::setUniform(_shader,&local_368,(vec3 *)CONCAT44(extraout_var_00,iVar6));
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    ppVar23 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
              ::operator->(&local_2f8);
    pLVar24 = vera::Light::getLightType(ppVar23->second);
    if (*pLVar24 == LIGHT_DIRECTIONAL) {
LAB_003b91a3:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_390,"u_lightDirection",&local_391);
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_2f8);
      vera::Shader::setUniform(_shader,&local_390,&ppVar23->second->direction);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
    }
    else {
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_2f8);
      pLVar24 = vera::Light::getLightType(ppVar23->second);
      if (*pLVar24 == LIGHT_SPOT) goto LAB_003b91a3;
    }
    ppVar23 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
              ::operator->(&local_2f8);
    if (0.0 < ppVar23->second->falloff) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3b8,"u_lightFalloff",&local_3b9);
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_2f8);
      vera::Shader::setUniform(_shader,&local_3b8,ppVar23->second->falloff);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3e0,"u_lightMatrix",&local_3e1);
    ppVar23 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
              ::operator->(&local_2f8);
    pmVar25 = vera::Light::getBiasMVPMatrix(ppVar23->second);
    vera::Shader::setUniform(_shader,&local_3e0,pmVar25,false);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_408,"u_lightShadowMap",(allocator *)((long)&it_6._M_node + 7));
    ppVar23 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
              ::operator->(&local_2f8);
    pFVar21 = vera::Light::getShadowMap(ppVar23->second);
    sVar2 = _shader->textureIndex;
    _shader->textureIndex = sVar2 + 1;
    vera::Shader::setUniformDepthTexture(_shader,&local_408,pFVar21,sVar2);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it_6._M_node + 7));
  }
  else {
    local_418._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
         ::begin(&(this->super_Scene).lights);
    while( true ) {
      name.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
           ::end(&(this->super_Scene).lights);
      bVar4 = std::operator!=(&local_418,(_Self *)((long)&name.field_2 + 8));
      if (!bVar4) break;
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_418);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                     "u_",&ppVar23->first);
      std::operator+(&local_460,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                     "Color");
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_418);
      vera::Shader::setUniform(_shader,&local_460,&ppVar23->second->color);
      std::__cxx11::string::~string((string *)&local_460);
      std::operator+(&local_480,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                     "Intensity");
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_418);
      vera::Shader::setUniform(_shader,&local_480,ppVar23->second->intensity);
      std::__cxx11::string::~string((string *)&local_480);
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_418);
      iVar6 = (*(ppVar23->second->super_Node)._vptr_Node[0x13])();
      vera::Shader::setUniform(_shader,(string *)local_440,(vec3 *)CONCAT44(extraout_var_01,iVar6));
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_418);
      pLVar24 = vera::Light::getLightType(ppVar23->second);
      if (*pLVar24 == LIGHT_DIRECTIONAL) {
LAB_003b97ad:
        std::operator+(&local_4a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_440,"Direction");
        ppVar23 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                  ::operator->(&local_418);
        vera::Shader::setUniform(_shader,&local_4a0,&ppVar23->second->direction);
        std::__cxx11::string::~string((string *)&local_4a0);
      }
      else {
        ppVar23 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                  ::operator->(&local_418);
        pLVar24 = vera::Light::getLightType(ppVar23->second);
        if (*pLVar24 == LIGHT_SPOT) goto LAB_003b97ad;
      }
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_418);
      if (0.0 < ppVar23->second->falloff) {
        std::operator+(&local_4c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_440,"Falloff");
        ppVar23 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                  ::operator->(&local_418);
        vera::Shader::setUniform(_shader,&local_4c0,ppVar23->second->falloff);
        std::__cxx11::string::~string((string *)&local_4c0);
      }
      std::operator+(&local_4e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                     "Matrix");
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_418);
      pmVar25 = vera::Light::getBiasMVPMatrix(ppVar23->second);
      vera::Shader::setUniform(_shader,&local_4e0,pmVar25,false);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::operator+(&local_500,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                     "ShadowMap");
      ppVar23 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
                ::operator->(&local_418);
      pFVar21 = vera::Light::getShadowMap(ppVar23->second);
      sVar2 = _shader->textureIndex;
      _shader->textureIndex = sVar2 + 1;
      vera::Shader::setUniformDepthTexture(_shader,&local_500,pFVar21,sVar2);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)local_440);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
      ::operator++(&local_418);
    }
  }
  if ((this->super_Scene).activeCubemap != (TextureCube *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_520,"u_cubeMap",&local_521);
    vera::Shader::setUniformTextureCube(_shader,&local_520,(this->super_Scene).activeCubemap);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_548,"u_SH",&local_549);
    vera::Shader::setUniform(_shader,&local_548,((this->super_Scene).activeCubemap)->SH,9);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator((allocator<char> *)&local_549);
  }
LAB_003b9c25:
  return (bool)(it._M_node._5_1_ & 1);
}

Assistant:

bool Uniforms::feedTo(vera::Shader *_shader, bool _lights, bool _buffers ) {
    bool update = false;

    // Pass native uniforms functions (u_time, u_data, etc...)
    for (UniformFunctionsMap::iterator it = functions.begin(); it != functions.end(); ++it) {
        if (!_lights && ( it->first == "u_scene" || it->first == "u_sceneDepth" || it->first == "u_sceneNormal" || it->first == "u_scenePosition") )
            continue;

        if (it->second.present)
            if (it->second.assign)
                it->second.assign( *_shader );
    }

    // Pass user defined uniforms (only if the shader code or scene had changed)
    // if (m_change) 
    {
        for (UniformDataMap::iterator it = data.begin(); it != data.end(); ++it) {
            _shader->setUniform(it->first, it->second.value.data(), it->second.size);
            if (it->second.change) {
                update += true;
            }
        }
    }

    // Pass sequence uniforms (the change every frame)
    for (UniformSequenceMap::iterator it = sequences.begin(); it != sequences.end(); ++it) {
        if (it->second.size() > 0) {
            size_t frame = m_frame % it->second.size();
            _shader->setUniform(it->first, it->second[frame].value.data(), it->second[frame].size);
            update += true;
        }
    }

    // Pass Textures Uniforms
    for (vera::TexturesMap::iterator it = textures.begin(); it != textures.end(); ++it) {
        _shader->setUniformTexture(it->first, it->second, _shader->textureIndex++ );
        _shader->setUniform(it->first+"Resolution", float(it->second->getWidth()), float(it->second->getHeight()));
    }

    for (vera::TextureStreamsMap::iterator it = streams.begin(); it != streams.end(); ++it) {
        for (size_t i = 0; i < it->second->getPrevTexturesTotal(); i++)
            _shader->setUniformTexture(it->first+"Prev["+vera::toString(i)+"]", it->second->getPrevTextureId(i), _shader->textureIndex++);

        _shader->setUniform(it->first+"Time", float(it->second->getTime()));
        _shader->setUniform(it->first+"Fps", float(it->second->getFps()));
        _shader->setUniform(it->first+"Duration", float(it->second->getDuration()));
        _shader->setUniform(it->first+"CurrentFrame", float(it->second->getCurrentFrame()));
        _shader->setUniform(it->first+"TotalFrames", float(it->second->getTotalFrames()));
    }

    // Pass Buffers Texture
    if (_buffers) {
        for (size_t i = 0; i < buffers.size(); i++)
            _shader->setUniformTexture("u_buffer" + vera::toString(i), buffers[i], _shader->textureIndex++ );

        for (size_t i = 0; i < doubleBuffers.size(); i++)
            _shader->setUniformTexture("u_doubleBuffer" + vera::toString(i), doubleBuffers[i]->src, _shader->textureIndex++ );
    
        for (size_t i = 0; i < floods.size(); i++)
            _shader->setUniformTexture("u_flood" + vera::toString(i), floods[i].dst, _shader->textureIndex++ );
    }

    // Pass Convolution Piramids resultant Texture
    for (size_t i = 0; i < pyramids.size(); i++)
        _shader->setUniformTexture("u_pyramid" + vera::toString(i), pyramids[i].getResult(), _shader->textureIndex++ );

    
    if (_lights) {
        // Pass Light Uniforms
        if (lights.size() == 1) {
            vera::LightsMap::iterator it = lights.begin();
            _shader->setUniform("u_lightColor", it->second->color);
            _shader->setUniform("u_lightIntensity", it->second->intensity);
            // if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
            _shader->setUniform("u_light", it->second->getPosition());
            if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                _shader->setUniform("u_lightDirection", it->second->direction);
            if (it->second->falloff > 0)
                _shader->setUniform("u_lightFalloff", it->second->falloff);
            _shader->setUniform("u_lightMatrix", it->second->getBiasMVPMatrix() );
            _shader->setUniformDepthTexture("u_lightShadowMap", it->second->getShadowMap(), _shader->textureIndex++ );
        }
        else {
            // TODO:
            //      - Lights should be pass as structs?? 

            for (vera::LightsMap::iterator it = lights.begin(); it != lights.end(); ++it) {
                std::string name = "u_" + it->first;

                _shader->setUniform(name + "Color", it->second->color);
                _shader->setUniform(name + "Intensity", it->second->intensity);
                // if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
                _shader->setUniform(name, it->second->getPosition());
                if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                    _shader->setUniform(name + "Direction", it->second->direction);
                if (it->second->falloff > 0)
                    _shader->setUniform(name +"Falloff", it->second->falloff);

                _shader->setUniform(name + "Matrix", it->second->getBiasMVPMatrix() );
                _shader->setUniformDepthTexture(name + "ShadowMap", it->second->getShadowMap(), _shader->textureIndex++ );
            }
        }
        
        if (activeCubemap) {
            _shader->setUniformTextureCube("u_cubeMap", (vera::TextureCube*)activeCubemap);
            _shader->setUniform("u_SH", activeCubemap->SH, 9);
        }
    }
    return update;
}